

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O0

vector<float,_std::allocator<float>_> * __thiscall
polyscope::render::backend_openGL_mock::GLTextureBuffer::getDataScalar(GLTextureBuffer *this)

{
  int iVar1;
  TextureBuffer *in_RSI;
  vector<float,_std::allocator<float>_> *in_RDI;
  vector<float,_std::allocator<float>_> *outData;
  TextureFormat *in_stack_ffffffffffffffc8;
  string local_30 [32];
  TextureBuffer *message;
  
  message = in_RSI;
  iVar1 = dimension(in_stack_ffffffffffffffc8);
  if (iVar1 != 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_30,"called getDataScalar on texture which does not have a 1 dimensional format"
               ,(allocator *)&stack0xffffffffffffffcf);
    exception((string *)message);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
  }
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x5116f6);
  TextureBuffer::getSizeX(in_RSI);
  TextureBuffer::getSizeY(in_RSI);
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)in_RSI,(size_type)in_RDI);
  return in_RDI;
}

Assistant:

std::vector<float> GLTextureBuffer::getDataScalar() {
  if (dimension(format) != 1) exception("called getDataScalar on texture which does not have a 1 dimensional format");
  std::vector<float> outData;
  outData.resize(getSizeX() * getSizeY());

  return outData;
}